

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop.cpp
# Opt level: O2

int __thiscall ncnn::UnaryOp::forward_inplace(UnaryOp *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  undefined1 in_XMM3 [16];
  undefined1 auVar7 [16];
  
  switch(this->op_type) {
  case 0:
    uVar3 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    pvVar1 = bottom_top_blob->data;
    uVar4 = 0;
    uVar2 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar2 = uVar4;
    }
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      *(uint *)((long)pvVar1 + uVar4 * 4) = *(uint *)((long)pvVar1 + uVar4 * 4) & 0x7fffffff;
    }
    break;
  case 1:
    uVar3 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    pvVar1 = bottom_top_blob->data;
    uVar4 = 0;
    uVar2 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar2 = uVar4;
    }
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      *(uint *)((long)pvVar1 + uVar4 * 4) = *(uint *)((long)pvVar1 + uVar4 * 4) ^ 0x80000000;
    }
    break;
  case 2:
    uVar3 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    pvVar1 = bottom_top_blob->data;
    uVar4 = 0;
    uVar2 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar2 = uVar4;
    }
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      fVar5 = floorf(*(float *)((long)pvVar1 + uVar4 * 4));
      *(float *)((long)pvVar1 + uVar4 * 4) = fVar5;
    }
    break;
  case 3:
    uVar3 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    pvVar1 = bottom_top_blob->data;
    uVar4 = 0;
    uVar2 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar2 = uVar4;
    }
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      fVar5 = ceilf(*(float *)((long)pvVar1 + uVar4 * 4));
      *(float *)((long)pvVar1 + uVar4 * 4) = fVar5;
    }
    break;
  case 4:
    uVar3 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    pvVar1 = bottom_top_blob->data;
    uVar4 = 0;
    uVar2 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar2 = uVar4;
    }
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      fVar5 = *(float *)((long)pvVar1 + uVar4 * 4);
      *(float *)((long)pvVar1 + uVar4 * 4) = fVar5 * fVar5;
    }
    break;
  case 5:
    uVar3 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    pvVar1 = bottom_top_blob->data;
    uVar4 = 0;
    uVar2 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar2 = uVar4;
    }
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      *(float *)((long)pvVar1 + uVar4 * 4) = SQRT(*(float *)((long)pvVar1 + uVar4 * 4));
    }
    break;
  case 6:
    uVar3 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    pvVar1 = bottom_top_blob->data;
    uVar4 = 0;
    uVar2 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar2 = uVar4;
    }
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      fVar5 = *(float *)((long)pvVar1 + uVar4 * 4);
      auVar7 = rsqrtss(in_XMM3,ZEXT416((uint)fVar5));
      fVar6 = auVar7._0_4_;
      in_XMM3._4_12_ = auVar7._4_12_;
      in_XMM3._0_4_ = fVar6 * -0.5 * (fVar5 * fVar6 * fVar6 + -3.0);
      *(float *)((long)pvVar1 + uVar4 * 4) = in_XMM3._0_4_;
    }
    break;
  case 7:
    uVar3 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    pvVar1 = bottom_top_blob->data;
    uVar4 = 0;
    uVar2 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar2 = uVar4;
    }
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      fVar5 = expf(*(float *)((long)pvVar1 + uVar4 * 4));
      *(float *)((long)pvVar1 + uVar4 * 4) = fVar5;
    }
    break;
  case 8:
    uVar3 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    pvVar1 = bottom_top_blob->data;
    uVar4 = 0;
    uVar2 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar2 = uVar4;
    }
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      fVar5 = logf(*(float *)((long)pvVar1 + uVar4 * 4));
      *(float *)((long)pvVar1 + uVar4 * 4) = fVar5;
    }
    break;
  case 9:
    uVar3 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    pvVar1 = bottom_top_blob->data;
    uVar4 = 0;
    uVar2 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar2 = uVar4;
    }
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      fVar5 = sinf(*(float *)((long)pvVar1 + uVar4 * 4));
      *(float *)((long)pvVar1 + uVar4 * 4) = fVar5;
    }
    break;
  case 10:
    uVar3 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    pvVar1 = bottom_top_blob->data;
    uVar4 = 0;
    uVar2 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar2 = uVar4;
    }
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      fVar5 = cosf(*(float *)((long)pvVar1 + uVar4 * 4));
      *(float *)((long)pvVar1 + uVar4 * 4) = fVar5;
    }
    break;
  case 0xb:
    uVar3 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    pvVar1 = bottom_top_blob->data;
    uVar4 = 0;
    uVar2 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar2 = uVar4;
    }
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      fVar5 = tanf(*(float *)((long)pvVar1 + uVar4 * 4));
      *(float *)((long)pvVar1 + uVar4 * 4) = fVar5;
    }
    break;
  case 0xc:
    uVar3 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    pvVar1 = bottom_top_blob->data;
    uVar4 = 0;
    uVar2 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar2 = uVar4;
    }
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      fVar5 = asinf(*(float *)((long)pvVar1 + uVar4 * 4));
      *(float *)((long)pvVar1 + uVar4 * 4) = fVar5;
    }
    break;
  case 0xd:
    uVar3 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    pvVar1 = bottom_top_blob->data;
    uVar4 = 0;
    uVar2 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar2 = uVar4;
    }
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      fVar5 = acosf(*(float *)((long)pvVar1 + uVar4 * 4));
      *(float *)((long)pvVar1 + uVar4 * 4) = fVar5;
    }
    break;
  case 0xe:
    uVar3 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    pvVar1 = bottom_top_blob->data;
    uVar4 = 0;
    uVar2 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar2 = uVar4;
    }
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      fVar5 = atanf(*(float *)((long)pvVar1 + uVar4 * 4));
      *(float *)((long)pvVar1 + uVar4 * 4) = fVar5;
    }
    break;
  case 0xf:
    uVar3 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    pvVar1 = bottom_top_blob->data;
    uVar4 = 0;
    uVar2 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar2 = uVar4;
    }
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      *(float *)((long)pvVar1 + uVar4 * 4) = 1.0 / *(float *)((long)pvVar1 + uVar4 * 4);
    }
    break;
  case 0x10:
    uVar3 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    pvVar1 = bottom_top_blob->data;
    uVar4 = 0;
    uVar2 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar2 = uVar4;
    }
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      fVar5 = tanhf(*(float *)((long)pvVar1 + uVar4 * 4));
      *(float *)((long)pvVar1 + uVar4 * 4) = fVar5;
    }
    break;
  case 0x11:
    uVar3 = bottom_top_blob->c * (int)bottom_top_blob->cstep;
    pvVar1 = bottom_top_blob->data;
    uVar4 = 0;
    uVar2 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar2 = uVar4;
    }
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      fVar5 = log10f(*(float *)((long)pvVar1 + uVar4 * 4));
      *(float *)((long)pvVar1 + uVar4 * 4) = fVar5;
    }
  }
  return 0;
}

Assistant:

int UnaryOp::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (op_type == Operation_ABS)
        return unary_op_inplace<unary_op_abs>(bottom_top_blob, opt);

    if (op_type == Operation_NEG)
        return unary_op_inplace<unary_op_neg>(bottom_top_blob, opt);

    if (op_type == Operation_FLOOR)
        return unary_op_inplace<unary_op_floor>(bottom_top_blob, opt);

    if (op_type == Operation_CEIL)
        return unary_op_inplace<unary_op_ceil>(bottom_top_blob, opt);

    if (op_type == Operation_SQUARE)
        return unary_op_inplace<unary_op_square>(bottom_top_blob, opt);

    if (op_type == Operation_SQRT)
        return unary_op_inplace<unary_op_sqrt>(bottom_top_blob, opt);

    if (op_type == Operation_RSQRT)
        return unary_op_inplace<unary_op_rsqrt>(bottom_top_blob, opt);

    if (op_type == Operation_EXP)
        return unary_op_inplace<unary_op_exp>(bottom_top_blob, opt);

    if (op_type == Operation_LOG)
        return unary_op_inplace<unary_op_log>(bottom_top_blob, opt);

    if (op_type == Operation_SIN)
        return unary_op_inplace<unary_op_sin>(bottom_top_blob, opt);

    if (op_type == Operation_COS)
        return unary_op_inplace<unary_op_cos>(bottom_top_blob, opt);

    if (op_type == Operation_TAN)
        return unary_op_inplace<unary_op_tan>(bottom_top_blob, opt);

    if (op_type == Operation_ASIN)
        return unary_op_inplace<unary_op_asin>(bottom_top_blob, opt);

    if (op_type == Operation_ACOS)
        return unary_op_inplace<unary_op_acos>(bottom_top_blob, opt);

    if (op_type == Operation_ATAN)
        return unary_op_inplace<unary_op_atan>(bottom_top_blob, opt);

    if (op_type == Operation_RECIPROCAL)
        return unary_op_inplace<unary_op_reciprocal>(bottom_top_blob, opt);

    if (op_type == Operation_TANH)
        return unary_op_inplace<unary_op_tanh>(bottom_top_blob, opt);

    if (op_type == Operation_LOG10)
        return unary_op_inplace<unary_op_log10>(bottom_top_blob, opt);

    return 0;
}